

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

TestRequired *
google::protobuf::DynamicCastMessage<proto2_unittest::TestRequired>(MessageLite *from)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LogMessage *this;
  TestRequired *pTVar3;
  TestRequired *this_00;
  string_view sVar4;
  string_view str;
  LogMessage LStack_38;
  MessageLite *pMStack_28;
  code *pcStack_20;
  
  pcStack_20 = (code *)0x87d20f;
  lVar2 = (**(code **)(proto2_unittest::_TestRequired_default_instance_ + 0x20))();
  pcStack_20 = (code *)0x87d21b;
  this_00 = (TestRequired *)from;
  iVar1 = (*from->_vptr_MessageLite[4])();
  if (lVar2 == CONCAT44(extraout_var,iVar1)) {
    return (TestRequired *)from;
  }
  pcStack_20 = DownCastMessage<proto2_unittest::TestAllTypes_const>;
  DynamicCastMessage<proto2_unittest::TestRequired>();
  pMStack_28 = from;
  pcStack_20 = (code *)lVar2;
  if (this_00 == (TestRequired *)0x0) {
    pTVar3 = (TestRequired *)0x0;
  }
  else {
    lVar2 = (**(code **)(proto2_unittest::_TestAllTypes_default_instance_ + 0x20))();
    iVar1 = (*(this_00->super_Message).super_MessageLite._vptr_MessageLite[4])(this_00);
    pTVar3 = (TestRequired *)0x0;
    if (lVar2 == CONCAT44(extraout_var_00,iVar1)) {
      pTVar3 = this_00;
    }
  }
  if (pTVar3 != this_00) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.h"
               ,0x595,"DynamicCastMessage<T>(from) == from");
    sVar4._M_str = "Cannot downcast ";
    sVar4._M_len = 0x10;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&LStack_38,sVar4);
    sVar4 = MessageLite::GetTypeName((MessageLite *)this_00);
    this = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,sVar4);
    str._M_str = " to ";
    str._M_len = 4;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this,str);
    sVar4 = MessageLite::GetTypeName
                      ((MessageLite *)&proto2_unittest::_TestAllTypes_default_instance_);
    absl::lts_20250127::log_internal::LogMessage::operator<<(this,sVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_38);
  }
  return this_00;
}

Assistant:

const T& DynamicCastMessage(const MessageLite& from) {
  const T* destination_message = DynamicCastMessage<T>(&from);
  if (ABSL_PREDICT_FALSE(destination_message == nullptr)) {
    // If exceptions are enabled, throw.
    // Otherwise, log a fatal error.
#if defined(ABSL_HAVE_EXCEPTIONS)
    throw std::bad_cast();
#endif
    // Move the logging into an out-of-line function to reduce bloat in the
    // caller.
    internal::FailDynamicCast(from, T::default_instance());
  }
  return *destination_message;
}